

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

MockSpec<void_(SDL_Renderer_*)> * __thiscall
testing::internal::FunctionMocker<void_(SDL_Renderer_*)>::With
          (MockSpec<void_(SDL_Renderer_*)> *__return_storage_ptr__,
          FunctionMocker<void_(SDL_Renderer_*)> *this,Matcher<SDL_Renderer_*> *m)

{
  MatcherBase<SDL_Renderer_*> local_20;
  
  local_20.vtable_ = (m->super_MatcherBase<SDL_Renderer_*>).vtable_;
  local_20.buffer_ = (Buffer)(m->super_MatcherBase<SDL_Renderer_*>).buffer_.shared;
  (m->super_MatcherBase<SDL_Renderer_*>).vtable_ = (VTable *)0x0;
  local_20.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00328148;
  __return_storage_ptr__->function_mocker_ = this;
  (__return_storage_ptr__->matchers_).super__Tuple_impl<0UL,_testing::Matcher<SDL_Renderer_*>_>.
  super__Head_base<0UL,_testing::Matcher<SDL_Renderer_*>,_false>._M_head_impl.
  super_MatcherBase<SDL_Renderer_*>.vtable_ = local_20.vtable_;
  (__return_storage_ptr__->matchers_).super__Tuple_impl<0UL,_testing::Matcher<SDL_Renderer_*>_>.
  super__Head_base<0UL,_testing::Matcher<SDL_Renderer_*>,_false>._M_head_impl.
  super_MatcherBase<SDL_Renderer_*>.buffer_.shared = (SharedPayloadBase *)local_20.buffer_;
  if ((local_20.vtable_ != (VTable *)0x0) &&
     ((local_20.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_20.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_20.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (__return_storage_ptr__->matchers_).super__Tuple_impl<0UL,_testing::Matcher<SDL_Renderer_*>_>.
  super__Head_base<0UL,_testing::Matcher<SDL_Renderer_*>,_false>._M_head_impl.
  super_MatcherBase<SDL_Renderer_*>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface
       = (_func_int **)&PTR__MatcherBase_00328148;
  MatcherBase<SDL_Renderer_*>::~MatcherBase(&local_20);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }